

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

void Adjust_Cursor_Position(FORM *form,char *pos)

{
  FIELD *pFVar1;
  int iVar2;
  int iVar3;
  
  pFVar1 = form->current;
  if ((pFVar1->buf <= pos) && (0 < pFVar1->dcols)) {
    iVar3 = (int)pos - (int)pFVar1->buf;
    iVar2 = iVar3 / pFVar1->dcols;
    form->currow = iVar2;
    form->curcol = iVar3 - pFVar1->cols * iVar2;
    if (pFVar1->drows < iVar2) {
      form->currow = 0;
    }
    return;
  }
  __assert_fail("pos >= field->buf && field->dcols > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x141,"void Adjust_Cursor_Position(FORM *, const char *)");
}

Assistant:

INLINE static void Adjust_Cursor_Position(FORM * form, const char * pos)
{
  FIELD *field;
  int idx;

  field = form->current;
  assert( pos >= field->buf && field->dcols > 0);
  idx = (int)( pos - field->buf );
#if USE_DIV_T
  *((div_t *)&(form->currow)) = div(idx,field->dcols);
#else
  form->currow = idx / field->dcols;
  form->curcol = idx - field->cols * form->currow;
#endif  
  if ( field->drows < form->currow )
    form->currow = 0;
}